

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

int __thiscall GeneticAlgorithm::init(GeneticAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  pointer pEVar1;
  time_t tVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  __node_base _Var4;
  undefined8 extraout_RAX_00;
  int iVar5;
  DataCenter *in_RDX;
  GeneticAlgorithm *pGVar6;
  pointer pEVar7;
  Endpoint EStack_d8;
  GeneticAlgorithm *pGStack_58;
  allocator_type local_29;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  
  DataCenter::operator=(&this->dataCenter,in_RDX);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  findNumberOfRequests(this);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_28,400,&local_29);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_M_move_assign(&this->population,&local_28);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_28);
  pGVar6 = this;
  generateInitialPopulation(this,200);
  pEVar1 = (pGVar6->dataCenter).endpoint.super__Vector_base<Endpoint,_std::allocator<Endpoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = extraout_RAX;
  pGStack_58 = this;
  for (pEVar7 = (pGVar6->dataCenter).endpoint.
                super__Vector_base<Endpoint,_std::allocator<Endpoint>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar7 != pEVar1; pEVar7 = pEVar7 + 1) {
    Endpoint::Endpoint(&EStack_d8,pEVar7);
    iVar5 = pGVar6->numberOfRequests;
    for (_Var4._M_nxt = EStack_d8.requests._M_h._M_before_begin._M_nxt;
        _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
      iVar5 = iVar5 + *(int *)((long)&_Var4._M_nxt[1]._M_nxt + 4);
      pGVar6->numberOfRequests = iVar5;
    }
    Endpoint::~Endpoint(&EStack_d8);
    uVar3 = extraout_RAX_00;
  }
  return (int)uVar3;
}

Assistant:

void GeneticAlgorithm::init(int generations, DataCenter dataCenter) {
    this->dataCenter = dataCenter ;
    srand (time(NULL));
    findNumberOfRequests();
    this->population = std::vector<std::vector<std::string>>(POPULATION_SIZE * 2);
    this->generateInitialPopulation(POPULATION_SIZE);
    for (int i = 0; i < generations; ++i) {
        std::cout << "Geração " << i << std::endl;
     //   std::cout << "Iniciando Cross" << std::endl;
        crossover();
      //  std::cout << "Iniciando Mut" << std::endl;

        mutation();
      //  std::cout << "Iniciando Sel" << std::endl;

        selection();
    }
    std::cout << "Pop Size" << this->population.size() << " "  << std::endl;

    for (std::vector<std::string> strings : this->population) {
        for(std::string string : strings){
            std::cout << string << " " ;
        }

        std::cout << std::endl;
        fitness(strings);
    }
    std::cout << "Best : " ;
    for(std::string string : bestSolution){
        std::cout << string << " " ;
    }

    std::cout << std::endl;
    std::cout << "Fitness == " << fitness(bestSolution) * -1 * 1000<< std::endl;

}